

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> *
mxx::impl::
distribute_container<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
::stable_distribute(basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                    *__return_storage_ptr__,
                   basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                   *c,comm *comm)

{
  int iVar1;
  int rank;
  unsigned_long uVar2;
  const_iterator begin;
  const_iterator end;
  iterator out;
  undefined1 local_60 [8];
  block_decomposition<unsigned_long> part;
  size_t total_size;
  size_t local_size;
  comm *local_20;
  comm *comm_local;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *c_local;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *result;
  
  local_20 = comm;
  comm_local = (comm *)c;
  c_local = __return_storage_ptr__;
  iVar1 = mxx::comm::size(comm);
  if (iVar1 == 1) {
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    basic_string(__return_storage_ptr__,
                 (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                  *)comm_local);
  }
  else {
    local_size._7_1_ = 0;
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    basic_string(__return_storage_ptr__);
    total_size = std::__cxx11::
                 basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 ::size((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                         *)comm_local);
    uVar2 = allreduce<unsigned_long>(&total_size,local_20);
    iVar1 = mxx::comm::size(local_20);
    rank = mxx::comm::rank(local_20);
    partition::block_decomposition<unsigned_long>::block_decomposition
              ((block_decomposition<unsigned_long> *)local_60,uVar2,iVar1,rank);
    uVar2 = partition::block_decomposition<unsigned_long>::local_size
                      ((block_decomposition<unsigned_long> *)local_60);
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    resize(__return_storage_ptr__,uVar2);
    begin = std::__cxx11::
            basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
            ::begin((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                     *)comm_local);
    end = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::end((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)comm_local);
    out = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::begin(__return_storage_ptr__);
    stable_distribute<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>>
              ((__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                )begin._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                )end._M_current,
               (__normal_iterator<unsigned_char_*,_std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                )out._M_current,local_20);
    local_size._7_1_ = 1;
    partition::block_decomposition<unsigned_long>::~block_decomposition
              ((block_decomposition<unsigned_long> *)local_60);
    if ((local_size._7_1_ & 1) == 0) {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      ~basic_string(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline static Container stable_distribute(const Container& c, const mxx::comm& comm) {
        if (comm.size() == 1)
            return c;
        Container result;
        size_t local_size = c.size();
        // TODO: this allreduce is duplicated in the `stable_distribute` function
        //       which could be avoided
        size_t total_size = mxx::allreduce(local_size, comm);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        result.resize(part.local_size());

        // call the iterator based implementation
        ::mxx::stable_distribute(c.begin(), c.end(), result.begin(), comm);

        // return the container
        return result;
    }